

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix-top.c
# Opt level: O2

void process_event(helix_session_t session,helix_event_t event)

{
  helix_event_mask_t hVar1;
  helix_trading_state_t hVar2;
  helix_order_book_t ob;
  helix_timestamp_t hVar3;
  char *pcVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long lVar7;
  ulong uVar8;
  size_t level;
  bool bVar9;
  
  hVar1 = helix_event_mask(event);
  if ((hVar1 & HELIX_EVENT_ORDER_BOOK_UPDATE) != 0) {
    ob = helix_event_order_book(event);
    hVar3 = helix_order_book_timestamp(ob);
    hVar2 = helix_order_book_state(ob);
    if (hVar2 == HELIX_TRADING_STATE_TRADING) {
      uVar8 = (hVar3 / 3600000) * -0xe10 + hVar3 / 1000;
      werase(_stdscr,uVar8,uVar8 % 0x3c);
      wmove(_stdscr,0,0);
      pcVar4 = helix_event_symbol(event);
      printw("%16s    %02lu:%02lu:%02lu.%03lu\n",pcVar4,hVar3 / 3600000,uVar8 / 0x3c,uVar8 % 0x3c,
             hVar3 % 1000);
      lVar7 = 5;
      level = 0;
      while( true ) {
        bVar9 = lVar7 == 0;
        lVar7 = lVar7 + -1;
        if (bVar9) break;
        wmove(_stdscr,level + 1 & 0xffffffff,0);
        uVar5 = helix_order_book_bid_size(ob,level);
        helix_order_book_bid_price(ob,level);
        helix_order_book_ask_price(ob,level);
        uVar6 = helix_order_book_ask_size(ob,level);
        printw("| %6lu  %.3f  %.3f  %-6lu |\n",uVar5,uVar6);
        level = level + 1;
      }
      wrefresh(_stdscr);
      return;
    }
  }
  return;
}

Assistant:

static void process_event(helix_session_t session, helix_event_t event)
{
	helix_event_mask_t mask = helix_event_mask(event);

	if (mask & HELIX_EVENT_ORDER_BOOK_UPDATE) {
		print_top(event);
	}
}